

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_timer_fast.c
# Opt level: O1

int s_timer_comparator(RBTNode *a,RBTNode *b,void *arg)

{
  int iVar1;
  
  iVar1 = *(int *)&a[1].left - *(int *)&b[1].left;
  if (iVar1 == 0) {
    iVar1 = -1;
    if (*(ulong *)(b + 1) <= *(ulong *)(a + 1)) {
      return (int)(*(ulong *)(b + 1) < *(ulong *)(a + 1));
    }
  }
  return iVar1;
}

Assistant:

int s_timer_comparator(const RBTNode* a, const RBTNode* b, void* arg) {
    s_timer_t* timer_a = GET_PARENT_ADDR(a, s_timer_t, rbt_node);
    s_timer_t* timer_b = GET_PARENT_ADDR(b, s_timer_t, rbt_node);
    (void)arg;

    my_clock_diff_t diff = (my_clock_diff_t)(timer_a->wakeup_ticks - timer_b->wakeup_ticks);
    if (diff != 0) {
        return (int)diff;
    }
    else {
        if (timer_a->task < timer_b->task)
            return -1;
        else if (timer_b->task < timer_a->task)
            return 1;
        else
            return 0;
    }
}